

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O0

void Abc_NtkPrintMiter(Abc_Ntk_t *pNtk)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  Abc_Obj_t *pAVar4;
  abctime aVar5;
  Abc_Obj_t *pAVar6;
  Abc_Obj_t *pAVar7;
  abctime aVar8;
  char *pcVar9;
  uint local_48;
  uint local_44;
  int nPis;
  int nUndec;
  int nSat;
  int nUnsat;
  abctime Time;
  int iOut;
  int i;
  Abc_Obj_t *pConst1;
  Abc_Obj_t *pChild;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtk_local;
  
  pAVar4 = Abc_AigConst1(pNtk);
  Time._0_4_ = 0xffffffff;
  aVar5 = Abc_Clock();
  nUndec = 0;
  nPis = 0;
  local_44 = 0;
  local_48 = 0;
  for (Time._4_4_ = 0; iVar1 = Abc_NtkPiNum(pNtk), (int)Time._4_4_ < iVar1;
      Time._4_4_ = Time._4_4_ + 1) {
    pAVar6 = Abc_NtkPi(pNtk,Time._4_4_);
    iVar1 = Abc_ObjFanoutNum(pAVar6);
    local_48 = (0 < iVar1) + local_48;
  }
  for (Time._4_4_ = 0; iVar1 = Abc_NtkPoNum(pNtk), (int)Time._4_4_ < iVar1;
      Time._4_4_ = Time._4_4_ + 1) {
    pAVar6 = Abc_NtkPo(pNtk,Time._4_4_);
    pAVar6 = Abc_ObjChild0(pAVar6);
    pAVar7 = Abc_ObjNot(pAVar4);
    if (pAVar6 == pAVar7) {
      nUndec = nUndec + 1;
    }
    else if (pAVar6 == pAVar4) {
      nPis = nPis + 1;
      if ((uint)Time == 0xffffffff) {
        Time._0_4_ = Time._4_4_;
      }
    }
    else {
      pAVar7 = Abc_ObjRegular(pAVar6);
      iVar1 = Abc_ObjIsPi(pAVar7);
      if (iVar1 == 0) {
        pAVar7 = Abc_ObjRegular(pAVar6);
        uVar3 = *(uint *)&pAVar7->field_0x14;
        uVar2 = Abc_ObjIsComplement(pAVar6);
        if ((uVar3 >> 7 & 1) == uVar2) {
          local_44 = local_44 + 1;
        }
        else {
          nPis = nPis + 1;
          if ((uint)Time == 0xffffffff) {
            Time._0_4_ = Time._4_4_;
          }
        }
      }
      else {
        nPis = nPis + 1;
        if ((uint)Time == 0xffffffff) {
          Time._0_4_ = Time._4_4_;
        }
      }
    }
  }
  printf("Miter:  I =%6d",(ulong)local_48);
  uVar3 = Abc_NtkNodeNum(pNtk);
  printf("  N =%7d",(ulong)uVar3);
  printf("  ? =%7d",(ulong)local_44);
  printf("  U =%6d",(ulong)(uint)nUndec);
  printf("  S =%6d",(ulong)(uint)nPis);
  aVar8 = Abc_Clock();
  printf(" %7.2f sec\n",(double)((float)(aVar8 - aVar5) / 1e+06));
  if (-1 < (int)(uint)Time) {
    pAVar4 = Abc_NtkPo(pNtk,(uint)Time);
    pcVar9 = Abc_ObjName(pAVar4);
    printf("The first satisfiable output is number %d (%s).\n",(ulong)(uint)Time,pcVar9);
  }
  return;
}

Assistant:

void Abc_NtkPrintMiter( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj, * pChild, * pConst1 = Abc_AigConst1(pNtk);
    int i, iOut = -1;
    abctime Time = Abc_Clock();
    int nUnsat = 0;
    int nSat   = 0;
    int nUndec = 0;
    int nPis   = 0;
    Abc_NtkForEachPi( pNtk, pObj, i )
        nPis += (int)( Abc_ObjFanoutNum(pObj) > 0 );
    Abc_NtkForEachPo( pNtk, pObj, i )
    {
        pChild = Abc_ObjChild0(pObj);
        // check if the output is constant 0
        if ( pChild == Abc_ObjNot(pConst1) )
            nUnsat++;
        // check if the output is constant 1
        else if ( pChild == pConst1 )
        {
            nSat++;
            if ( iOut == -1 )
                iOut = i;
        }
        // check if the output is a primary input
        else if ( Abc_ObjIsPi(Abc_ObjRegular(pChild)) )
        {
            nSat++;
            if ( iOut == -1 )
                iOut = i;
        }
    // check if the output is 1 for the 0000 pattern
        else if ( Abc_ObjRegular(pChild)->fPhase != (unsigned)Abc_ObjIsComplement(pChild) )
        {
            nSat++;
            if ( iOut == -1 )
                iOut = i;
        }
        else
            nUndec++;
    }
    printf( "Miter:  I =%6d", nPis );
    printf( "  N =%7d", Abc_NtkNodeNum(pNtk) );
    printf( "  ? =%7d", nUndec );
    printf( "  U =%6d", nUnsat );
    printf( "  S =%6d", nSat );
    Time = Abc_Clock() - Time;
    printf(" %7.2f sec\n", (float)(Time)/(float)(CLOCKS_PER_SEC));
    if ( iOut >= 0 )
        printf( "The first satisfiable output is number %d (%s).\n", iOut, Abc_ObjName( Abc_NtkPo(pNtk, iOut) ) );
}